

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

OpenMPClause * OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive)

{
  size_type sVar1;
  OpenMPClause *this;
  mapped_type *ppvVar2;
  OpenMPUsesAllocatorsClause *this_00;
  key_type local_2c;
  OpenMPUsesAllocatorsClause *local_28;
  OpenMPClause *new_clause;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *current_clauses;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *all_clauses;
  OpenMPDirective *directive_local;
  
  all_clauses = (map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                 *)directive;
  current_clauses =
       (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)
       OpenMPDirective::getAllClauses(directive);
  new_clause = (OpenMPClause *)
               OpenMPDirective::getClauses((OpenMPDirective *)all_clauses,OMPC_uses_allocators);
  local_28 = (OpenMPUsesAllocatorsClause *)0x0;
  sVar1 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
  if (sVar1 == 0) {
    this = (OpenMPClause *)operator_new(0x18);
    memset(this,0,0x18);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)this);
    local_2c = OMPC_uses_allocators;
    new_clause = this;
    ppvVar2 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[]((map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                            *)current_clauses,&local_2c);
    *ppvVar2 = (mapped_type)this;
  }
  this_00 = (OpenMPUsesAllocatorsClause *)operator_new(0x80);
  OpenMPUsesAllocatorsClause(this_00);
  local_28 = this_00;
  std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
            ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause,
             (value_type *)&local_28);
  return &local_28->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive) {
    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_uses_allocators);
    OpenMPClause* new_clause = NULL;
    if (current_clauses->size() == 0) {
        current_clauses = new std::vector<OpenMPClause *>();
        (*all_clauses)[OMPC_uses_allocators] = current_clauses;
    };
    new_clause = new OpenMPUsesAllocatorsClause();
    current_clauses->push_back(new_clause);

    return new_clause;
}